

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

void rd_1dim_slice(char **content,size_t *line_no,int *array,int dim,int shift,int post)

{
  char *pcVar1;
  char *cp;
  int post_local;
  int shift_local;
  int dim_local;
  int *array_local;
  size_t *line_no_local;
  char **content_local;
  
  pcVar1 = get_array1(content,line_no,array + shift,(dim - shift) - post);
  if (pcVar1 != (char *)0x0) {
    vrna_message_error("\nrd_1dim: %s",pcVar1);
    exit(1);
  }
  return;
}

Assistant:

PRIVATE void
rd_1dim_slice(char    **content,
              size_t  *line_no,
              int     *array,
              int     dim,
              int     shift,
              int     post)
{
  char *cp;

  cp = get_array1(content, line_no, array + shift, dim - shift - post);

  if (cp) {
    vrna_message_error("\nrd_1dim: %s", cp);
    exit(1);
  }

  return;
}